

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# targets.c
# Opt level: O1

void addreloc(Section *sec,Reloc *r,uint16_t pos,uint16_t siz,lword mask)

{
  RelocInsert *pRVar1;
  RelocInsert *pRVar2;
  RelocInsert *pRVar3;
  list *l;
  
  pRVar2 = (RelocInsert *)alloc(0x18);
  pRVar2->next = (RelocInsert *)0x0;
  pRVar2->bpos = pos;
  pRVar2->bsiz = siz;
  pRVar2->mask = mask;
  pRVar1 = r->insert;
  if (r->insert == (RelocInsert *)0x0) {
    pRVar3 = (RelocInsert *)&r->insert;
  }
  else {
    do {
      pRVar3 = pRVar1;
      pRVar1 = pRVar3->next;
    } while (pRVar3->next != (RelocInsert *)0x0);
  }
  pRVar3->next = pRVar2;
  if ((sec != (Section *)0x0) && ((r->n).next == (node *)0x0)) {
    l = &sec->relocs;
    if (r->xrefname != (char *)0x0) {
      l = &sec->xrefs;
    }
    addtail(l,&r->n);
    return;
  }
  return;
}

Assistant:

void addreloc(struct Section *sec,struct Reloc *r,
              uint16_t pos,uint16_t siz,lword mask)
/* Add a relocation description of the current type to this relocation,
   which will be inserted into the sections reloc list, if not
   already done. */
{
  struct RelocInsert *ri,*new;

  new = initRelocInsert(NULL,pos,siz,mask);
  if (ri = r->insert) {
    while (ri->next)
      ri = ri->next;
    ri->next = new;
  }
  else
    r->insert = new;

  if (r->n.next==NULL && sec!=NULL) {
    if (r->xrefname)
      addtail(&sec->xrefs,&r->n);  /* add to current section's XRef list */
    else
      addtail(&sec->relocs,&r->n);  /* add to current section's Reloc list */
  }
}